

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void check_vectors<char>(vector<char,_std::allocator<char>_> *lhs,
                        vector<char,_std::allocator<char>_> *rhs)

{
  undefined8 uVar1;
  bool bVar2;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RSI;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RDI;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_cstring<const_char> local_b0 [2];
  undefined1 local_90 [32];
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 local_48 [24];
  undefined1 local_30 [8];
  equal_coll_impl *in_stack_ffffffffffffffd8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe8;
  
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&stack0xffffffffffffffe0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/test_common.h"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffff10);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (uVar1,(basic_cstring<const_char> *)&stack0xffffffffffffffe0,0x11,local_30);
    local_58 = (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffff08);
    local_60 = (char *)std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffff08);
    local_68 = (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffff08);
    local_70 = (char *)std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffff08);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_ffffffffffffffd8,in_RDI,in_RSI,in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffff18,(char (*) [1])in_stack_ffffffffffffff10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/test_common.h"
               ,0x6b);
    in_stack_ffffffffffffff18 = "lhs.end()";
    in_stack_ffffffffffffff10 = "lhs.begin()";
    in_stack_ffffffffffffff08 = (vector<char,_std::allocator<char>_> *)0x4;
    boost::test_tools::tt_detail::report_assertion(local_48,local_90,local_b0,0x11,1,0xd);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x13a5d4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13a5e1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

void check_vectors(const std::vector<T>& lhs, const std::vector<T>& rhs) {
  BOOST_CHECK_EQUAL_COLLECTIONS(lhs.begin(), lhs.end(), rhs.begin(), rhs.end());
}